

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

VkDeviceSize
vkt::api::anon_unknown_1::getPageTableSize(PlatformMemoryLimits *limits,VkDeviceSize allocationSize)

{
  ulong align;
  unsigned_long uVar1;
  VkDeviceSize numPagesNeeded;
  VkDeviceSize coveredAddressSpaceSize;
  size_t levelNdx;
  VkDeviceSize totalSize;
  VkDeviceSize allocationSize_local;
  PlatformMemoryLimits *limits_local;
  
  levelNdx = 0;
  for (coveredAddressSpaceSize = 0; coveredAddressSpaceSize < limits->devicePageTableHierarchyLevels
      ; coveredAddressSpaceSize = coveredAddressSpaceSize + 1) {
    align = limits->devicePageSize << ((byte)coveredAddressSpaceSize & 0x3f);
    uVar1 = alignToPowerOfTwo<unsigned_long>(allocationSize,align);
    levelNdx = (uVar1 / align) * limits->devicePageTableEntrySize + levelNdx;
  }
  return levelNdx;
}

Assistant:

VkDeviceSize getPageTableSize (const PlatformMemoryLimits& limits, VkDeviceSize allocationSize)
{
	VkDeviceSize	totalSize	= 0;

	for (size_t levelNdx = 0; levelNdx < limits.devicePageTableHierarchyLevels; ++levelNdx)
	{
		const VkDeviceSize	coveredAddressSpaceSize	= limits.devicePageSize<<levelNdx;
		const VkDeviceSize	numPagesNeeded			= alignToPowerOfTwo(allocationSize, coveredAddressSpaceSize) / coveredAddressSpaceSize;

		totalSize += numPagesNeeded*limits.devicePageTableEntrySize;
	}

	return totalSize;
}